

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O3

void __thiscall
tsl::detail_robin_hash::
bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>
::bucket_entry(bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>
               *this,bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>
                     *other)

{
  (this->super_bucket_entry_hash<true>).m_hash = (other->super_bucket_entry_hash<true>).m_hash;
  this->m_dist_from_ideal_bucket = -1;
  this->m_last_bucket = other->m_last_bucket;
  if (other->m_dist_from_ideal_bucket != -1) {
    std::__cxx11::wstring::wstring
              ((wstring *)&(this->m_value).__align,(wstring *)&(other->m_value).__align);
    *(undefined4 *)((long)&this->m_value + 0x20) = *(undefined4 *)((long)&other->m_value + 0x20);
    this->m_dist_from_ideal_bucket = other->m_dist_from_ideal_bucket;
  }
  return;
}

Assistant:

bucket_entry(bucket_entry&& other) noexcept(std::is_nothrow_move_constructible<value_type>::value): 
            bucket_hash(std::move(other)),
            m_dist_from_ideal_bucket(EMPTY_MARKER_DIST_FROM_IDEAL_BUCKET), 
            m_last_bucket(other.m_last_bucket) 
    {
        if(!other.empty()) {
            ::new (static_cast<void*>(std::addressof(m_value))) value_type(std::move(other.value()));
            m_dist_from_ideal_bucket = other.m_dist_from_ideal_bucket;
        }
    }